

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::register_global_read_dependencies
          (Compiler *this,SPIRFunction *func,uint32_t id)

{
  uint32_t id_00;
  SPIRBlock *block_00;
  uint32_t local_3c;
  TypedID<(spirv_cross::Types)6> *pTStack_38;
  TypedID<(spirv_cross::Types)6> block;
  TypedID<(spirv_cross::Types)6> *__end1;
  TypedID<(spirv_cross::Types)6> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *__range1;
  uint32_t id_local;
  SPIRFunction *func_local;
  Compiler *this_local;
  
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::begin
                     (&(func->blocks).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>
                     );
  pTStack_38 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::end
                         (&(func->blocks).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>);
  for (; __end1 != pTStack_38; __end1 = __end1 + 1) {
    local_3c = __end1->id;
    id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_3c);
    block_00 = get<spirv_cross::SPIRBlock>(this,id_00);
    register_global_read_dependencies(this,block_00,id);
  }
  return;
}

Assistant:

void Compiler::register_global_read_dependencies(const SPIRFunction &func, uint32_t id)
{
	for (auto block : func.blocks)
		register_global_read_dependencies(get<SPIRBlock>(block), id);
}